

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O0

void __thiscall
wabt::LexerSourceLineFinder::LexerSourceLineFinder
          (LexerSourceLineFinder *this,
          unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *source)

{
  pointer this_00;
  int local_24 [3];
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *local_18;
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *source_local;
  LexerSourceLineFinder *this_local;
  
  local_18 = source;
  source_local = &this->source_;
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::unique_ptr
            (&this->source_,source);
  std::vector<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>::vector
            (&this->line_ranges_);
  this->next_line_start_ = 0;
  this->last_cr_ = false;
  this->eof_ = false;
  this_00 = std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::operator->
                      (&this->source_);
  local_24[2] = (int)LexerSource::Seek(this_00,0);
  local_24[1] = 0;
  local_24[0] = 0;
  std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
  emplace_back<int,int>
            ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>> *)
             &this->line_ranges_,local_24 + 1,local_24);
  return;
}

Assistant:

LexerSourceLineFinder::LexerSourceLineFinder(
    std::unique_ptr<LexerSource> source)
    : source_(std::move(source)),
      next_line_start_(0),
      last_cr_(false),
      eof_(false) {
  source_->Seek(0);
  // Line 0 should not be used; but it makes indexing simpler.
  line_ranges_.emplace_back(0, 0);
}